

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::add_fixed<unsigned_int>
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this,uint value)

{
  assert_error *paVar1;
  uint local_14;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *pbStack_10;
  uint value_local;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this_local;
  
  local_14 = value;
  pbStack_10 = this;
  if (this->m_pos != 0) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar1,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (this->m_data == (fixed_size_buffer_adaptor *)0x0) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar1,"m_data");
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  buffer_customization<protozero::fixed_size_buffer_adaptor>::append
            (this->m_data,(char *)&local_14,4);
  return;
}

Assistant:

void add_fixed(T value) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
#if PROTOZERO_BYTE_ORDER != PROTOZERO_LITTLE_ENDIAN
        byteswap_inplace(&value);
#endif
        buffer_customization<TBuffer>::append(m_data, reinterpret_cast<const char*>(&value), sizeof(T));
    }